

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableFilter.cpp
# Opt level: O0

void __thiscall
Ptex::v2_2::PtexSeparableFilter::applyToCorner
          (PtexSeparableFilter *this,PtexSeparableKernel *k,int faceid,FaceInfo *f,int eid)

{
  int iVar1;
  bool bVar2;
  EdgeId EVar3;
  int iVar4;
  FaceInfo *in_RCX;
  int in_EDX;
  PtexSeparableKernel *in_RDI;
  int in_R8D;
  float fVar5;
  float fVar6;
  PtexSeparableKernel kc;
  int i_1;
  float newWeight;
  float initialWeight;
  bool primary;
  bool isSubface;
  int prevFace;
  int i;
  int numCorners;
  FaceInfo *cface [10];
  int cedgeId [10];
  int cfaceId [10];
  int MaxValence;
  bool prevIsSubface;
  FaceInfo *af;
  int aeid;
  int afid;
  int in_stack_fffffffffffffe6c;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  PtexSeparableKernel *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  float in_stack_fffffffffffffe8c;
  PtexSeparableKernel *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffea0;
  int local_104;
  int local_f0;
  int local_ec;
  undefined8 auStack_e8 [10];
  int aiStack_98 [4];
  FaceInfo *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  PtexSeparableKernel *in_stack_ffffffffffffff88;
  PtexSeparableFilter *in_stack_ffffffffffffff90;
  int aiStack_68 [10];
  undefined4 local_40;
  bool local_39;
  FaceInfo *local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_14;
  
  local_38 = in_RCX;
  local_2c = in_R8D;
  local_28 = in_EDX;
  local_24 = in_R8D;
  local_14 = in_EDX;
  local_39 = FaceInfo::isSubface(in_RCX);
  local_40 = 10;
  local_ec = 0;
  local_f0 = 0;
  do {
    iVar1 = local_28;
    if (9 < local_f0) {
LAB_0014af20:
      if (local_ec == 1) {
        applyToCornerFace((PtexSeparableFilter *)in_stack_fffffffffffffe90,
                          (PtexSeparableKernel *)
                          CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                          (FaceInfo *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                          in_stack_fffffffffffffe78,(FaceInfo *)in_RDI,in_stack_fffffffffffffea0);
      }
      else if (local_ec < 2) {
        fVar5 = PtexSeparableKernel::weight(in_RDI);
        in_RDI->kubuff[2] = in_RDI->kubuff[2] - fVar5;
      }
      else {
        PtexSeparableKernel::rotate(in_RDI,in_stack_fffffffffffffe6c);
        fVar5 = PtexSeparableKernel::weight(in_RDI);
        fVar6 = PtexSeparableKernel::makeSymmetric
                          (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
        for (local_104 = 1; local_104 <= local_ec; local_104 = local_104 + 1) {
          PtexSeparableKernel::PtexSeparableKernel
                    (in_stack_fffffffffffffe90,
                     (PtexSeparableKernel *)
                     CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          applyToCornerFace((PtexSeparableFilter *)in_stack_fffffffffffffe90,
                            (PtexSeparableKernel *)
                            CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                            (FaceInfo *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                            in_stack_fffffffffffffe78,(FaceInfo *)in_RDI,in_stack_fffffffffffffea0);
        }
        in_RDI->kubuff[2] = fVar6 * (float)local_ec + -fVar5 + in_RDI->kubuff[2];
      }
      return;
    }
    local_28 = FaceInfo::adjface(local_38,local_2c);
    EVar3 = FaceInfo::adjedge(local_38,local_2c);
    local_2c = (int)(EVar3 + e_right) % 4;
    if ((local_28 < 0) || ((local_28 == local_14 && (local_2c == local_24)))) {
      local_ec = local_f0 + -2;
      goto LAB_0014af20;
    }
    local_38 = (FaceInfo *)
               (**(code **)(**(long **)&in_RDI->v + 0x80))(*(long **)&in_RDI->v,local_28);
    aiStack_68[local_f0] = local_28;
    aiStack_98[local_f0] = local_2c;
    auStack_e8[local_f0] = local_38;
    bVar2 = FaceInfo::isSubface(local_38);
    if ((((local_39 & 1U) != 0) && (!bVar2)) &&
       (iVar4 = FaceInfo::adjface(local_38,(local_2c + 3) % 4), iVar4 == iVar1)) {
      PtexSeparableKernel::adjustSubfaceToMain(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
      PtexSeparableKernel::rotate(in_RDI,in_stack_fffffffffffffe6c);
      splitAndApply(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                    in_stack_ffffffffffffff78);
      return;
    }
    local_f0 = local_f0 + 1;
    local_39 = bVar2;
  } while( true );
}

Assistant:

void PtexSeparableFilter::applyToCorner(PtexSeparableKernel& k, int faceid,
                                        const Ptex::FaceInfo& f, int eid)
{
    // traverse clockwise around corner vertex and gather corner faces
    int afid = faceid, aeid = eid;
    const FaceInfo* af = &f;
    bool prevIsSubface = af->isSubface();

    const int MaxValence = 10;
    int cfaceId[MaxValence];
    int cedgeId[MaxValence];
    const FaceInfo* cface[MaxValence];

    int numCorners = 0;
    for (int i = 0; i < MaxValence; i++) {
        // advance to next face
        int prevFace = afid;
        afid = af->adjface(aeid);
        aeid = (af->adjedge(aeid) + 1) % 4;

        // we hit a boundary or reached starting face
        // note: we need to check edge id too because we might have
        // a periodic texture (w/ toroidal topology) where all 4 corners
        // are from the same face
        if (afid < 0 || (afid == faceid && aeid == eid)) {
            numCorners = i - 2;
            break;
        }

        // record face info
        af = &_tx->getFaceInfo(afid);
        cfaceId[i] = afid;
        cedgeId[i] = aeid;
        cface[i] = af;

        // check to see if corner is a subface "tee"
        bool isSubface = af->isSubface();
        if (prevIsSubface && !isSubface && af->adjface((aeid+3)%4) == prevFace)
        {
            // adjust the eid depending on whether we started from
            // the primary or secondary subface.
            bool primary = (i==1);
            k.adjustSubfaceToMain(eid + primary * 2);
            k.rotate(eid - aeid + 3 - primary);
            splitAndApply(k, afid, *af);
            return;
        }
        prevIsSubface = isSubface;
    }

    if (numCorners == 1) {
        // regular case (valence 4)
        applyToCornerFace(k, f, eid, cfaceId[1], *cface[1], cedgeId[1]);
    }
    else if (numCorners > 1) {
        // valence 5+, make kernel symmetric and apply equally to each face
        // first, rotate to standard orientation, u=v=0
        k.rotate(eid + 2);
        float initialWeight = k.weight();
        float newWeight = k.makeSymmetric(initialWeight);
        for (int i = 1; i <= numCorners; i++) {
            PtexSeparableKernel kc = k;
            applyToCornerFace(kc, f, 2, cfaceId[i], *cface[i], cedgeId[i]);
        }
        // adjust weight for symmetrification and for additional corners
        _weight += newWeight * (float)numCorners - initialWeight;
    }
    else {
        // valence 2 or 3, ignore corner face (just adjust weight)
        _weight -= k.weight();
    }
}